

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O0

int nn_surveyor_send(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  uint8_t *buf;
  nn_chunkref *in_RSI;
  nn_surveyor *in_RDI;
  nn_chunkref *unaff_retaddr;
  nn_surveyor *surveyor;
  nn_surveyor *src;
  int type;
  nn_surveyor *self_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  src = in_RDI;
  if (in_RDI == (nn_surveyor *)0x0) {
    src = (nn_surveyor *)0x0;
  }
  src->surveyid = src->surveyid + 1;
  src->surveyid = src->surveyid | 0x80000000;
  self_00 = src;
  sVar3 = nn_chunkref_size((nn_chunkref *)src);
  if (sVar3 == 0) {
    nn_chunkref_term((nn_chunkref *)self_00);
    nn_chunkref_init(unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    buf = (uint8_t *)nn_chunkref_data(in_RSI);
    nn_putl(buf,self_00->surveyid);
    nn_msg_term((nn_msg *)0x14294b);
    nn_msg_mv((nn_msg *)self_00,(nn_msg *)src);
    nn_msg_init((nn_msg *)self_00,(size_t)src);
    type = (int)((ulong)src >> 0x20);
    iVar1 = nn_surveyor_inprogress(self_00);
    if (iVar1 == 0) {
      nn_fsm_action((nn_fsm *)self_00,type);
      iVar1 = 0;
    }
    else {
      uVar2 = nn_xsurveyor_events((nn_sockbase *)in_RDI);
      if ((uVar2 & 2) == 0) {
        iVar1 = -0xb;
      }
      else {
        nn_fsm_action((nn_fsm *)self_00,type);
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/surveyor.c"
          ,0xcb);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_surveyor_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, xsurveyor.sockbase);

    /*  Generate new survey ID. */
    ++surveyor->surveyid;
    surveyor->surveyid |= 0x80000000;

    /*  Tag the survey body with survey ID. */
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_init (&msg->sphdr, 4);
    nn_putl (nn_chunkref_data (&msg->sphdr), surveyor->surveyid);

    /*  Store the survey, so that it can be sent later on. */
    nn_msg_term (&surveyor->tosend);
    nn_msg_mv (&surveyor->tosend, msg);
    nn_msg_init (msg, 0);

    /*  Cancel any ongoing survey, if any. */
    if (nn_slow (nn_surveyor_inprogress (surveyor))) {

        /*  First check whether the survey can be sent at all. */
        if (!(nn_xsurveyor_events (&surveyor->xsurveyor.sockbase) &
              NN_SOCKBASE_EVENT_OUT))
            return -EAGAIN;

        /*  Cancel the current survey. */
        nn_fsm_action (&surveyor->fsm, NN_SURVEYOR_ACTION_CANCEL);

        return 0;
    }

    /*  Notify the state machine that the survey was started. */
    nn_fsm_action (&surveyor->fsm, NN_SURVEYOR_ACTION_START);

    return 0;
}